

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::__inplace_merge<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (long __first,long __middle,long __last)

{
  QGraphicsItem **ppQVar1;
  long lVar2;
  long __len;
  ulong uVar3;
  long lVar4;
  pair<QGraphicsItem_**,_long> pVar5;
  
  if (__middle == __last || __first == __middle) {
    return;
  }
  lVar4 = __middle - __first >> 3;
  lVar2 = __last - __middle >> 3;
  __len = lVar4;
  if (lVar2 < lVar4) {
    __len = lVar2;
  }
  pVar5 = get_temporary_buffer<QGraphicsItem*>(__len);
  ppQVar1 = pVar5.first;
  if (ppQVar1 == (QGraphicsItem **)0x0) {
    __merge_without_buffer<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (__first,__middle,__last,lVar4,lVar2);
    uVar3 = 0;
  }
  else {
    __merge_adaptive<QList<QGraphicsItem*>::iterator,long_long,QGraphicsItem**,__gnu_cxx::__ops::_Iter_less_iter>
              (__first,__middle,__last,lVar4,lVar2,ppQVar1,pVar5.second);
    uVar3 = pVar5.second << 3;
  }
  operator_delete(ppQVar1,uVar3);
  return;
}

Assistant:

inline constexpr bool operator==(iterator o) const { return i == o.i; }